

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantPrimitiveSetTestInstance::
compare(InvariantPrimitiveSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  bool bVar1;
  const_reference primitivesA_00;
  const_reference primitivesB_00;
  size_type sVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_1b0;
  int local_2c;
  PerPrimitiveVec *pPStack_28;
  int param_3_local;
  PerPrimitiveVec *primitivesB_local;
  PerPrimitiveVec *primitivesA_local;
  InvariantPrimitiveSetTestInstance *this_local;
  
  local_2c = param_3;
  pPStack_28 = primitivesB;
  primitivesB_local = primitivesA;
  primitivesA_local = (PerPrimitiveVec *)this;
  primitivesA_00 =
       std::
       vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
       ::operator[](primitivesA,0);
  primitivesB_00 =
       std::
       vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
       ::operator[](pPStack_28,0);
  sVar2 = std::
          vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::size(primitivesB_local);
  bVar1 = comparePrimitivesExact(primitivesA_00,primitivesB_00,(int)sVar2);
  if (!bVar1) {
    this_00 = Context::getTestContext
                        ((this->super_InvarianceTestInstance).super_TestInstance.m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_1b0,
                         (char (*) [62])
                         "Failure: tessellation coordinates differ between two programs");
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return bVar1;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (!comparePrimitivesExact(&primitivesA[0], &primitivesB[0], static_cast<int>(primitivesA.size())))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: tessellation coordinates differ between two programs" << tcu::TestLog::EndMessage;

			return false;
		}
		return true;
	}